

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void checkPropertyConsistency<bool>
               (cmGeneratorTarget *depender,cmGeneratorTarget *dependee,string *propName,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emitted,string *config,CompatibleType t,bool *param_7)

{
  pointer pcVar1;
  cmLocalGenerator *this;
  pointer pbVar2;
  bool bVar3;
  char *__s;
  size_t sVar4;
  string *psVar5;
  long *plVar6;
  ostream *poVar7;
  size_type *psVar8;
  pointer __v;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string pname;
  string pdir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  ostringstream e;
  string local_288;
  string *local_268;
  cmGeneratorTarget *local_260;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  cmGeneratorTarget *local_200;
  string *local_1f8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_268 = propName;
  local_260 = depender;
  local_1f8 = config;
  local_1f0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)emitted;
  __s = cmGeneratorTarget::GetProperty(dependee,propName);
  if (__s != (char *)0x0) {
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8._0_8_ = local_1a8 + 0x10;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar4);
    cmSystemTools::ExpandListArgument((string *)local_1a8,&local_218,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar1,pcVar1 + psVar5->_M_string_length);
    local_200 = dependee;
    std::__cxx11::string::append((char *)&local_238);
    pbVar2 = local_218.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __v = local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar1 = (__v->_M_dataplus)._M_p;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar1,pcVar1 + __v->_M_string_length);
        cmSystemTools::HelpFileName(&local_258,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,&local_238,&local_258);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_1a8);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_288.field_2._M_allocated_capacity = *psVar8;
          local_288.field_2._8_8_ = plVar6[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = *psVar8;
          local_288._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_288._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        bVar3 = cmsys::SystemTools::FileExists(&local_288,true);
        if (bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(local_200->Target->Name)._M_dataplus._M_p,
                              (local_200->Target->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" has property \"",0x10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(__v->_M_dataplus)._M_p,__v->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" listed in its ",0x10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(local_268->_M_dataplus)._M_p,local_268->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     " property.  This is not allowed.  Only user-defined properties may appear listed in the "
                     ,0x58);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(local_268->_M_dataplus)._M_p,local_268->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," property.",10);
          this = local_260->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
LAB_00177768:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        pVar9 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>(local_1f0,__v);
        if ((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
           (((checkInterfacePropertyCompatibility<bool>
                        (local_260,__v,local_1f8,"FALSE",BoolType,(bool *)0x0),
             cmSystemTools::s_ErrorOccured != false || (cmSystemTools::s_FatalErrorOccured != false)
             ) || (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)))) goto LAB_00177768;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        __v = __v + 1;
      } while (__v != pbVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
  }
  return;
}

Assistant:

void checkPropertyConsistency(cmGeneratorTarget const* depender,
                              cmGeneratorTarget const* dependee,
                              const std::string& propName,
                              std::set<std::string>& emitted,
                              const std::string& config, CompatibleType t,
                              PropertyType* /*unused*/)
{
  const char* prop = dependee->GetProperty(propName);
  if (!prop) {
    return;
  }

  std::vector<std::string> props;
  cmSystemTools::ExpandListArgument(prop, props);
  std::string pdir = cmSystemTools::GetCMakeRoot();
  pdir += "/Help/prop_tgt/";

  for (std::string const& p : props) {
    std::string pname = cmSystemTools::HelpFileName(p);
    std::string pfile = pdir + pname + ".rst";
    if (cmSystemTools::FileExists(pfile, true)) {
      std::ostringstream e;
      e << "Target \"" << dependee->GetName() << "\" has property \"" << p
        << "\" listed in its " << propName
        << " property.  "
           "This is not allowed.  Only user-defined properties may appear "
           "listed in the "
        << propName << " property.";
      depender->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str());
      return;
    }
    if (emitted.insert(p).second) {
      getLinkInterfaceDependentProperty<PropertyType>(depender, p, config, t,
                                                      nullptr);
      if (cmSystemTools::GetErrorOccuredFlag()) {
        return;
      }
    }
  }
}